

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhRestorePage(lhash_kv_engine *pEngine,unqlite_page *pPage)

{
  int rc;
  unqlite_page *pPage_local;
  lhash_kv_engine *pEngine_local;
  
  pEngine_local._4_4_ = (*pEngine->pIo->xWrite)(pEngine->pHeader);
  if ((pEngine_local._4_4_ == 0) &&
     (pEngine_local._4_4_ = (*pEngine->pIo->xWrite)(pPage), pEngine_local._4_4_ == 0)) {
    SyBigEndianPack64(pPage->zData,pEngine->nFreeList);
    pEngine->nFreeList = pPage->iPage;
    SyBigEndianPack64(pEngine->pHeader->zData + 8,pEngine->nFreeList);
    pEngine_local._4_4_ = 0;
  }
  return pEngine_local._4_4_;
}

Assistant:

static int lhRestorePage(lhash_kv_engine *pEngine,unqlite_page *pPage)
{
	int rc;
	rc = pEngine->pIo->xWrite(pEngine->pHeader);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	rc = pEngine->pIo->xWrite(pPage);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Link to the list of free page */
	SyBigEndianPack64(pPage->zData,pEngine->nFreeList);
	pEngine->nFreeList = pPage->iPage;
	SyBigEndianPack64(&pEngine->pHeader->zData[4/*Magic*/+4/*Hash*/],pEngine->nFreeList);
	/* All done */
	return UNQLITE_OK;
}